

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read669.c
# Opt level: O3

int it_669_read_sample_header(IT_SAMPLE *sample,DUMBFILE *f)

{
  int32 iVar1;
  int iVar2;
  int iVar3;
  
  dumbfile_getnc((char *)sample,0xd,f);
  sample->name[0xd] = '\0';
  sample->filename[0] = '\0';
  iVar1 = dumbfile_igetl(f);
  sample->length = iVar1;
  iVar1 = dumbfile_igetl(f);
  sample->loop_start = iVar1;
  iVar1 = dumbfile_igetl(f);
  sample->loop_end = iVar1;
  iVar2 = dumbfile_error(f);
  iVar3 = -1;
  if (iVar2 == 0) {
    iVar2 = sample->length;
    if (iVar2 < 1) {
      sample->flags = '\0';
    }
    else {
      sample->flags = '\x01';
      sample->global_volume = '@';
      sample->default_volume = '@';
      sample->default_pan = '\0';
      sample->C5_speed = 0x20ab;
      iVar3 = sample->loop_end;
      if ((iVar2 < iVar3) && (sample->loop_start == 0)) {
        sample->loop_end = 0;
        iVar3 = 0;
      }
      if (iVar2 < iVar3) {
        sample->loop_end = iVar2;
        iVar3 = iVar2;
      }
      if (2 < iVar3 - sample->loop_start) {
        sample->flags = '\x11';
      }
      sample->finetune = 0;
      sample->vibrato_speed = '\0';
      sample->vibrato_depth = '\0';
      sample->vibrato_rate = '\0';
      sample->vibrato_waveform = '\0';
      sample->max_resampling_quality = -1;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int it_669_read_sample_header(IT_SAMPLE *sample, DUMBFILE *f)
{
    dumbfile_getnc((char *)sample->name, 13, f);
	sample->name[13] = 0;

	sample->filename[0] = 0;

	sample->length = dumbfile_igetl(f);
	sample->loop_start = dumbfile_igetl(f);
	sample->loop_end = dumbfile_igetl(f);

	if (dumbfile_error(f))
		return -1;

	if (sample->length <= 0) {
		sample->flags = 0;
		return 0;
	}

	sample->flags = IT_SAMPLE_EXISTS;

	sample->global_volume = 64;
	sample->default_volume = 64;

	sample->default_pan = 0;
	sample->C5_speed = 8363;
	// the above line might be wrong

	if ((sample->loop_end > sample->length) && !(sample->loop_start))
		sample->loop_end = 0;

	if (sample->loop_end > sample->length)
		sample->loop_end = sample->length;

	if (sample->loop_end - sample->loop_start > 2)
		sample->flags |= IT_SAMPLE_LOOP;

	sample->vibrato_speed = 0;
	sample->vibrato_depth = 0;
	sample->vibrato_rate = 0;
	sample->vibrato_waveform = 0; // do we have to set _all_ these?
	sample->finetune = 0;
	sample->max_resampling_quality = -1;

	return 0;
}